

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

void __thiscall
wasm::TranslateToFuzzReader::addInvocations(TranslateToFuzzReader *this,Function *func)

{
  Module *pMVar1;
  string_view target;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar2;
  undefined1 auVar3 [8];
  size_t type;
  bool bVar4;
  long lVar5;
  uintptr_t *puVar6;
  Type type_00;
  ulong extraout_RDX;
  Name NVar7;
  Name NVar8;
  Name name_00;
  Name name_01;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar9;
  Name value;
  undefined1 auStack_158 [8];
  FunctionCreationContext context;
  Expression *local_d0;
  Block *local_c8;
  Random *local_c0;
  Builder *local_b8;
  Function *local_b0;
  undefined1 auStack_a8 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> invocations;
  undefined1 auStack_88 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> args;
  Expression *local_68;
  HeapType *local_60;
  undefined1 local_58 [8];
  Name name;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> invoker;
  Expression *invoke;
  
  local_b0 = func;
  IString::toString_abi_cxx11_((string *)auStack_a8,(IString *)func);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_88,"_invoker",(allocator<char> *)&invoker);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_158,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_88);
  IString::IString((IString *)local_58,(string *)auStack_158);
  std::__cxx11::string::~string((string *)auStack_158);
  std::__cxx11::string::~string((string *)auStack_88);
  std::__cxx11::string::~string((string *)auStack_a8);
  NVar7.super_IString.str._M_str = (char *)local_58;
  NVar7.super_IString.str._M_len = (size_t)this->wasm;
  lVar5 = ::wasm::Module::getFunctionOrNull(NVar7);
  if ((lVar5 == 0) &&
     (NVar8.super_IString.str._M_str = (char *)local_58,
     NVar8.super_IString.str._M_len = (size_t)this->wasm,
     lVar5 = ::wasm::Module::getExportOrNull(NVar8), type = name.super_IString.str._M_len,
     auVar3 = local_58, lVar5 == 0)) {
    ::wasm::HeapType::HeapType
              ((HeapType *)&context.typeLocals._M_h._M_single_bucket,(Signature)ZEXT816(0));
    auStack_158 = (undefined1  [8])0x0;
    context.parent = (TranslateToFuzzReader *)0x0;
    context.func = (Function *)0x0;
    name_00.super_IString.str._M_str = (char *)auVar3;
    name_00.super_IString.str._M_len = (size_t)&name.super_IString.str._M_str;
    Builder::makeFunction
              (name_00,(HeapType)type,
               (vector<wasm::Type,_std::allocator<wasm::Type>_> *)
               context.typeLocals._M_h._M_single_bucket,(Expression *)auStack_158);
    std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
              ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_158);
    local_c8 = MixedArena::alloc<wasm::Block>(&((this->builder).wasm)->allocator);
    local_b8 = &this->builder;
    *(Block **)(name.super_IString.str._M_str + 0x60) = local_c8;
    context.hangStack.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)&context.typeLocals._M_h._M_rehash_policy._M_next_resize;
    context.parent = (TranslateToFuzzReader *)name.super_IString.str._M_str;
    context.labelIndex = 0;
    context._44_4_ = 0;
    context.hangStack.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    context.hangStack.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    context.func = (Function *)0x0;
    context.breakableStack.
    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0;
    context.breakableStack.
    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = 0;
    context.breakableStack.
    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0;
    context.breakableStack.
    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._12_8_ = 0;
    context.typeLocals._M_h._M_buckets = (__buckets_ptr)0x1;
    context.typeLocals._M_h._M_bucket_count = 0;
    context.typeLocals._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    context.typeLocals._M_h._M_element_count._0_4_ = 0x3f800000;
    context.typeLocals._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    context.typeLocals._M_h._M_rehash_policy._4_4_ = 0;
    context.typeLocals._M_h._M_rehash_policy._M_next_resize = 0;
    this->funcContext = (FunctionCreationContext *)auStack_158;
    invocations.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    auStack_a8 = (undefined1  [8])0x0;
    invocations.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_c0 = &this->random;
    local_60 = &local_b0->type;
    auStack_158 = (undefined1  [8])this;
    while ((bVar4 = Random::oneIn(local_c0,2), bVar4 && ((this->random).finishedInput == false))) {
      auStack_88 = (undefined1  [8])0x0;
      args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68 = (Expression *)::wasm::HeapType::getSignature();
      invoker._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
      super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
           (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
           &local_68;
      invoke = (Expression *)0x0;
      PVar9 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
              Type::end((Type *)invoker._M_t.
                                super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
      for (; PVar2.index = (size_t)invoke,
          PVar2.parent = (Type *)invoker._M_t.
                                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                 .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,
          PVar9 != PVar2; invoke = (Expression *)((long)&invoke->_id + 1)) {
        puVar6 = (uintptr_t *)::wasm::Type::Iterator::operator*((Iterator *)&invoker);
        local_d0 = makeConst(this,(Type)*puVar6);
        std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
        emplace_back<wasm::Expression*>
                  ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_88,
                   &local_d0);
      }
      target = (local_b0->super_Importable).super_Named.name.super_IString.str;
      ::wasm::HeapType::getSignature();
      invoker._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
      super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
           (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
           Builder::makeCall(local_b8,(Name)target,
                             (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                             auStack_88,type_00,false);
      ::wasm::HeapType::getSignature();
      if (1 < extraout_RDX) {
        invoker._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
        _M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
        super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
             (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
             Builder::makeDrop(local_b8,(Expression *)
                                        invoker._M_t.
                                        super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                        .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl
                              );
      }
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_a8,
                 (value_type *)&invoker);
      bVar4 = Random::oneIn(local_c0,2);
      if (bVar4) {
        local_68 = makeMemoryHashLogging(this);
        std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
        emplace_back<wasm::Expression*>
                  ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_a8,
                   &local_68);
      }
      std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
                ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_88
                );
    }
    if (auStack_a8 !=
        (undefined1  [8])
        invocations.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
      set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)
                 &local_c8->list,
                 (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_a8);
      ::wasm::Module::addFunction((unique_ptr *)this->wasm);
      pMVar1 = this->wasm;
      name_01.super_IString.str._M_str = (char *)local_58;
      name_01.super_IString.str._M_len = (size_t)auStack_88;
      value.super_IString.str._M_str = (char *)local_58;
      value.super_IString.str._M_len = name.super_IString.str._M_len;
      Builder::makeExport(name_01,value,(ExternalKind)name.super_IString.str._M_len);
      ::wasm::Module::addExport((unique_ptr *)pMVar1);
      std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::~unique_ptr
                ((unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)auStack_88);
    }
    std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
              ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_a8);
    FunctionCreationContext::~FunctionCreationContext((FunctionCreationContext *)auStack_158);
    std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr
              ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
               &name.super_IString.str._M_str);
  }
  return;
}

Assistant:

void TranslateToFuzzReader::addInvocations(Function* func) {
  Name name = func->name.toString() + std::string("_invoker");
  if (wasm.getFunctionOrNull(name) || wasm.getExportOrNull(name)) {
    return;
  }
  auto invoker = builder.makeFunction(name, Signature(), {});
  Block* body = builder.makeBlock();
  invoker->body = body;
  FunctionCreationContext context(*this, invoker.get());
  std::vector<Expression*> invocations;
  while (oneIn(2) && !random.finished()) {
    std::vector<Expression*> args;
    for (const auto& type : func->getParams()) {
      args.push_back(makeConst(type));
    }
    Expression* invoke = builder.makeCall(func->name, args, func->getResults());
    if (func->getResults().isConcrete()) {
      invoke = builder.makeDrop(invoke);
    }
    invocations.push_back(invoke);
    // log out memory in some cases
    if (oneIn(2)) {
      invocations.push_back(makeMemoryHashLogging());
    }
  }
  if (invocations.empty()) {
    return;
  }
  body->list.set(invocations);
  wasm.addFunction(std::move(invoker));
  wasm.addExport(builder.makeExport(name, name, ExternalKind::Function));
}